

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Cues::~Cues(Cues *this)

{
  CuePoint **ppCVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  
  ppCVar1 = this->m_cue_points;
  lVar2 = this->m_count;
  lVar3 = this->m_preload_count;
  if (ppCVar1 != ppCVar1 + lVar2 + lVar3) {
    lVar5 = 0;
    do {
      pvVar4 = *(void **)((long)ppCVar1 + lVar5);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("pCP",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x739,"mkvparser::Cues::~Cues()");
      }
      if (*(void **)((long)pvVar4 + 0x20) != (void *)0x0) {
        operator_delete__(*(void **)((long)pvVar4 + 0x20));
      }
      operator_delete(pvVar4);
      lVar5 = lVar5 + 8;
    } while (lVar3 * 8 + lVar2 * 8 != lVar5);
  }
  if (this->m_cue_points != (CuePoint **)0x0) {
    operator_delete__(this->m_cue_points);
    return;
  }
  return;
}

Assistant:

Cues::~Cues() {
  const long n = m_count + m_preload_count;

  CuePoint** p = m_cue_points;
  CuePoint** const q = p + n;

  while (p != q) {
    CuePoint* const pCP = *p++;
    assert(pCP);

    delete pCP;
  }

  delete[] m_cue_points;
}